

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_helper.cpp
# Opt level: O2

pair<double,_double>
Performance_Test::runPerformanceTest(performanceFunction function,uint32_t size)

{
  pair<double,_double> pVar1;
  TimerContainer timer;
  TimerContainer local_38;
  
  local_38.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node._M_size = 0;
  local_38.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  local_38._startTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  (*function)(&local_38,size);
  pVar1 = BaseTimerContainer::mean(&local_38.super_BaseTimerContainer);
  std::__cxx11::_List_base<double,_std::allocator<double>_>::_M_clear
            ((_List_base<double,_std::allocator<double>_> *)&local_38);
  return pVar1;
}

Assistant:

std::pair < double, double > runPerformanceTest(performanceFunction function, uint32_t size )
    {
        Performance_Test::TimerContainer timer;
        function( timer, size  );
        return timer.mean();
    }